

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImGuiContext *g;
  ImVec2 IVar7;
  
  pIVar3 = GImGui;
  IVar6 = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  pIVar4 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  if ((iVar2 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar2].PopupId == IVar6)) {
    if (((pIVar3->NextWindowData).Flags & 1) == 0) {
      IVar1 = (pIVar3->IO).DisplaySize;
      IVar7.x = IVar1.x * 0.5;
      IVar7.y = IVar1.y * 0.5;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      (pIVar4->NextWindowData).PosVal = IVar7;
      (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar4->NextWindowData).PosCond = 4;
    }
    bVar5 = Begin(name,p_open,flags | 0xc000020);
    if (bVar5) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar3->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}